

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextInput.cpp
# Opt level: O1

bool removeUtf8Char(string *value,size_t position)

{
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  start;
  int iVar1;
  uint uVar2;
  ulong uVar3;
  const_iterator it;
  iterator it_2;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50 [2];
  long local_40 [2];
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_30;
  
  uVar3 = value->_M_string_length;
  if (position < uVar3) {
    iVar1 = (int)position + -1;
    local_50[0]._M_current = (value->_M_dataplus)._M_p;
    if (0 < iVar1) {
      do {
        if (local_50[0]._M_current == (value->_M_dataplus)._M_p + value->_M_string_length) break;
        utf8::unchecked::next<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                  (local_50);
        iVar1 = iVar1 + -1;
      } while (iVar1 != 0);
    }
    uVar3 = (long)local_50[0]._M_current - (long)(value->_M_dataplus)._M_p;
    if (uVar3 != 0xffffffffffffffff) {
      if ((value->_M_string_length != 0) &&
         (local_50[0]._M_current = (value->_M_dataplus)._M_p, 0 < (int)position)) {
        do {
          if (local_50[0]._M_current == (value->_M_dataplus)._M_p + value->_M_string_length) break;
          utf8::unchecked::next<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                    (local_50);
          uVar2 = (int)position - 1;
          position = (size_t)uVar2;
        } while (uVar2 != 0);
      }
      std::__cxx11::string::erase((ulong)value,uVar3);
      if (uVar3 != 0xffffffffffffffff) {
        return true;
      }
    }
  }
  else {
    start._M_current = (value->_M_dataplus)._M_p;
    local_30._M_current = start._M_current + uVar3;
    if (uVar3 != 0) {
      utf8::prior<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>(&local_30,start);
      local_50[0]._M_current = (char *)local_40;
      std::__cxx11::string::_M_construct<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                ((string *)local_50,(value->_M_dataplus)._M_p,local_30._M_current);
      std::__cxx11::string::operator=((string *)value,(string *)local_50);
      if ((long *)local_50[0]._M_current != local_40) {
        operator_delete(local_50[0]._M_current,local_40[0] + 1);
      }
      if (uVar3 != 0) {
        return true;
      }
    }
  }
  return false;
}

Assistant:

inline static bool removeUtf8Char(std::string& value, size_t position) {
    /* optimize the normal case, at the end... */
    if (position >= value.size()) {
        std::string::iterator it = value.end();
        const std::string::iterator start = value.begin();
        if (it != start) {
            utf8::prior(it, start);
            value = std::string(value.begin(), it);
            return true;
        }
    }
    else {
        const size_t offset = u8offset(value, position - 1);
        if (offset != std::string::npos) {
            const size_t end = u8offset(value, position);
            value.erase(offset, end - offset);
            return true;
        }
    }

    return false;
}